

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

QPDF_Bool * __thiscall qpdf::BaseHandle::as<QPDF_Bool>(BaseHandle *this)

{
  QPDF *qpdf;
  bool bVar1;
  element_type *peVar2;
  shared_ptr<QPDFObject> *obj;
  QPDF_Reference *obj_00;
  BaseHandle local_50 [2];
  QPDFObjGen local_30;
  BaseHandle local_28;
  BaseHandle *local_18;
  BaseHandle *this_local;
  
  local_18 = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    bVar1 = std::
            holds_alternative<QPDF_Bool,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                      (&peVar2->value);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      this_local = (BaseHandle *)
                   std::
                   get<QPDF_Bool,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                             (&peVar2->value);
    }
    else {
      peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      bVar1 = std::
              holds_alternative<QPDF_Unresolved,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&peVar2->value);
      if (bVar1) {
        peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        qpdf = peVar2->qpdf;
        peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        local_30 = peVar2->og;
        obj = QPDF::Resolver::resolved(qpdf,local_30);
        BaseHandle(&local_28,obj);
        this_local = (BaseHandle *)as<QPDF_Bool>(&local_28);
        ~BaseHandle(&local_28);
      }
      else {
        peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        bVar1 = std::
                holds_alternative<QPDF_Reference,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                          (&peVar2->value);
        if (bVar1) {
          peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
          obj_00 = std::
                   get<QPDF_Reference,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                             (&peVar2->value);
          BaseHandle(local_50,&obj_00->obj);
          this_local = (BaseHandle *)as<QPDF_Bool>(local_50);
          ~BaseHandle(local_50);
        }
        else {
          this_local = (BaseHandle *)0x0;
        }
      }
    }
  }
  else {
    this_local = (BaseHandle *)0x0;
  }
  return (QPDF_Bool *)this_local;
}

Assistant:

T*
    BaseHandle::as() const
    {
        if (!obj) {
            return nullptr;
        }
        if (std::holds_alternative<T>(obj->value)) {
            return &std::get<T>(obj->value);
        }
        if (std::holds_alternative<QPDF_Unresolved>(obj->value)) {
            return BaseHandle(QPDF::Resolver::resolved(obj->qpdf, obj->og)).as<T>();
        }
        if (std::holds_alternative<QPDF_Reference>(obj->value)) {
            // see comment in QPDF_Reference.
            return BaseHandle(std::get<QPDF_Reference>(obj->value).obj).as<T>();
        }
        return nullptr;
    }